

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O3

NumericConstant __thiscall
mp::BasicExprFactory<AllocatorRef<testing::NiceMock<MockAllocator>,_char>_>::MakeNumericConstant
          (BasicExprFactory<AllocatorRef<testing::NiceMock<MockAllocator>,_char>_> *this,
          double value)

{
  Impl *impl;
  NumericConstant NVar1;
  Impl *local_10;
  
  local_10 = (Impl *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)&this->exprs_,&local_10);
  impl = (Impl *)operator_new__(0x80);
  impl->kind_ = FIRST_EXPR;
  (this->exprs_).
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = impl;
  *(double *)(impl + 2) = value;
  NVar1 = internal::ExprBase::Create<mp::NumericConstant>(impl);
  return (NumericConstant)
         NVar1.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_;
}

Assistant:

NumericConstant MakeNumericConstant(double value) {
    NumericConstant::Impl *impl = Allocate<NumericConstant>(expr::NUMBER);
    impl->value = value;
    return Expr::Create<NumericConstant>(impl);
  }